

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void DrawMarker(FTexture *tex,double x,double y,int yadjust,INTBOOL flip,double xscale,double yscale
               ,int translation,double alpha,DWORD fillcolor,FRenderStyle renderstyle)

{
  double dVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  DFrameBuffer *this;
  int iVar6;
  FRemapTable *pFVar7;
  undefined4 in_register_00000014;
  uint uVar8;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double y_local;
  double x_local;
  
  if ((tex != (FTexture *)0x0) && (tex->UseType != '\r')) {
    y_local = y;
    x_local = x;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive)))) {
      AM_rotatePoint(&x_local,&y_local);
    }
    this = screen;
    iVar5 = f_y;
    uVar11 = (ulong)(uint)f_x;
    iVar6 = (int)((x_local - m_x) * scale_mtof) + f_x;
    dVar12 = (double)f_h;
    dVar13 = (y_local - m_y) * scale_mtof;
    iVar9 = yadjust + f_y;
    uVar3 = tex->Width;
    dVar1 = (tex->Scale).X;
    dVar14 = (double)CleanXfac;
    uVar4 = tex->Height;
    dVar2 = (tex->Scale).Y;
    dVar15 = (double)CleanYfac;
    uVar10 = f_h + f_y;
    uVar8 = f_w + f_x;
    pFVar7 = TranslationToTable(translation);
    DCanvas::DrawTexture
              ((DCanvas *)this,tex,(double)iVar6,(double)(iVar9 + (int)(dVar12 - dVar13)),0x400013af
               ,dVar14 * ((double)uVar3 / dVar1) * xscale,dVar15 * ((double)uVar4 / dVar2) * yscale,
               alpha,0x400013b0,0x400013a1,(ulong)(uint)iVar5,0x400013a2,(ulong)uVar10,0x400013a3,
               uVar11,0x400013a4,(ulong)uVar8,0x40001395,CONCAT44(in_register_00000014,flip),
               0x4000138e,pFVar7,0x4000138c,0x4000138d,CONCAT44(in_register_00000084,fillcolor),
               0x400013a9,CONCAT44(in_register_0000008c,renderstyle.AsDWORD),0);
  }
  return;
}

Assistant:

static void DrawMarker (FTexture *tex, double x, double y, int yadjust,
	INTBOOL flip, double xscale, double yscale, int translation, double alpha, DWORD fillcolor, FRenderStyle renderstyle)
{
	if (tex == NULL || tex->UseType == FTexture::TEX_Null)
	{
		return;
	}
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&x, &y);
	}
	screen->DrawTexture (tex, CXMTOF(x) + f_x, CYMTOF(y) + yadjust + f_y,
		DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * xscale,
		DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * yscale,
		DTA_ClipTop, f_y,
		DTA_ClipBottom, f_y + f_h,
		DTA_ClipLeft, f_x,
		DTA_ClipRight, f_x + f_w,
		DTA_FlipX, flip,
		DTA_Translation, TranslationToTable(translation),
		DTA_AlphaF, alpha,
		DTA_FillColor, fillcolor,
		DTA_RenderStyle, DWORD(renderstyle),
		TAG_DONE);
}